

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int tinyexr::DecodeChunk
              (EXRImage *exr_image,EXRHeader *exr_header,
              vector<unsigned_long,_std::allocator<unsigned_long>_> *offsets,uchar *head,size_t size
              ,string *err)

{
  int iVar1;
  int num_channels;
  int iVar2;
  int compression_type;
  int line_order;
  int iVar3;
  EXRChannelInfo *pEVar4;
  pointer puVar5;
  long lVar6;
  EXRAttribute *attributes;
  int *piVar7;
  int num_lines;
  size_t sVar8;
  bool bVar9;
  undefined4 uVar10;
  int iVar11;
  ulong uVar12;
  EXRTile *pEVar13;
  uchar **ppuVar14;
  long *plVar15;
  ostream *poVar16;
  int iVar17;
  int iVar18;
  int *piVar19;
  ulong uVar20;
  int iVar21;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar22;
  uint uVar23;
  int iVar24;
  unsigned_long uVar25;
  ulong uVar26;
  int iVar27;
  size_t y_idx;
  ulong __new_size;
  size_t __size;
  long lVar28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar29;
  long lVar30;
  ulong pixel_data_size;
  bool bVar31;
  bool bVar32;
  EXRChannelInfo *in_stack_fffffffffffffd68;
  pointer puVar33;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list_00;
  char *local_240;
  size_type local_238;
  char local_230 [16];
  ulong local_220;
  ulong local_218;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_210;
  int local_204;
  size_t local_200;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  stringstream ss;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar1 = exr_header->compression_type;
  iVar18 = 0x10;
  if ((iVar1 != 3) && (iVar1 != 0x80)) {
    if (iVar1 == 4) {
      iVar18 = 0x20;
    }
    else {
      iVar18 = 1;
    }
  }
  iVar1 = (exr_header->data_window).max_x;
  iVar27 = (exr_header->data_window).min_x;
  iVar17 = iVar1 - iVar27;
  if (iVar1 < iVar27) {
LAB_00171ea0:
    if (err != (string *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (err,"Invalid data window.\n");
    }
    return -4;
  }
  iVar1 = (exr_header->data_window).max_y;
  iVar27 = (exr_header->data_window).min_y;
  uVar23 = iVar1 - iVar27;
  local_218 = (ulong)uVar23;
  if (iVar1 < iVar27) goto LAB_00171ea0;
  iVar1 = iVar17 + 1;
  iVar27 = uVar23 + 1;
  if (0x7fffff < iVar17 || 0x7fffff < (int)uVar23) {
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"data_with or data_height too large. data_width: ",0x30);
    poVar16 = (ostream *)std::ostream::operator<<(local_1a8,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"data_height = ",0xe);
    plVar15 = (long *)std::ostream::operator<<(poVar16,iVar27);
    std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
    std::ostream::put((char)plVar15);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (err,local_240,local_238);
    if (local_240 != local_230) {
      operator_delete(local_240);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::ios_base::~ios_base(local_138);
    return -4;
  }
  num_channels = exr_header->num_channels;
  __new_size = (ulong)num_channels;
  uVar12 = (long)(offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar4 = exr_header->channels;
  local_210 = offsets;
  local_200 = size;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&channel_offset_list,__new_size);
  pixel_data_size = 0;
  bVar31 = num_channels == 0;
  if (!bVar31) {
    piVar19 = &pEVar4->pixel_type;
    uVar25 = 0;
    bVar31 = false;
    uVar20 = 1;
    do {
      uVar23 = (uint)pixel_data_size;
      channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar20 - 1] = uVar25;
      uVar26 = (ulong)(uint)*piVar19;
      if (2 < uVar26) break;
      uVar23 = uVar23 + *(int *)(&DAT_002a0a40 + uVar26 * 4);
      pixel_data_size = (ulong)uVar23;
      uVar25 = uVar25 + *(long *)(&DAT_002a0a50 + uVar26 * 8);
      bVar31 = __new_size <= uVar20;
      piVar19 = piVar19 + 0x44;
      bVar32 = uVar20 != __new_size;
      uVar20 = uVar20 + 1;
    } while (bVar32);
    pixel_data_size = (ulong)(int)uVar23;
  }
  if (!bVar31) {
    iVar18 = -4;
    if (err != (string *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (err,"Failed to compute channel layout.\n");
    }
    goto LAB_001728d4;
  }
  if (exr_header->tiled == 0) {
    local_218 = (long)iVar1 * __new_size * (long)iVar27 - 1;
    if (local_218 < 0x3fffffffff) {
      ppuVar14 = AllocateImage(num_channels,exr_header->channels,exr_header->requested_pixel_types,
                               iVar1,iVar27);
      sVar8 = local_200;
      exr_image->images = ppuVar14;
      uVar23 = (uint)(uVar12 >> 3);
      if ((int)uVar23 < 1) goto LAB_0017272b;
      pvVar22 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                (ulong)(uVar23 & 0x7fffffff);
      pvVar29 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      channel_offset_list_00 = pvVar22;
      bVar32 = false;
      do {
        uVar25 = (local_210->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[(long)pvVar29];
        bVar31 = true;
        if (uVar25 + 8 <= sVar8) {
          iVar17 = *(int *)(head + uVar25 + 4);
          if ((ulong)(long)iVar17 <= sVar8 - (uVar25 + 8)) {
            iVar24 = *(int *)(head + uVar25);
            pvVar22 = channel_offset_list_00;
            if (iVar17 != 0 && 0xffbffffe < iVar24 - 0x200001U) {
              iVar11 = (exr_header->data_window).max_y + 1;
              if (iVar24 + iVar18 <= iVar11) {
                iVar11 = iVar24 + iVar18;
              }
              if (iVar11 - iVar24 != 0 && iVar24 <= iVar11) {
                iVar2 = (exr_header->data_window).min_y;
                iVar21 = -1;
                if (0xffffffff00000000 < ((long)iVar24 - (long)iVar2) - 0x80000000U) {
                  iVar21 = iVar24 - iVar2;
                }
                if ((-1 < iVar21) &&
                   (bVar9 = DecodePixelData(exr_image->images,exr_header->requested_pixel_types,
                                            head + uVar25 + 8,(long)iVar17,
                                            exr_header->compression_type,exr_header->line_order,
                                            iVar1,iVar27,iVar1,(int)pvVar29,iVar21,iVar11 - iVar24,
                                            pixel_data_size,(long)exr_header->num_channels,
                                            (EXRAttribute *)exr_header->channels,
                                            (size_t)&channel_offset_list,in_stack_fffffffffffffd68,
                                            channel_offset_list_00),
                   channel_offset_list_00 = pvVar22, bVar31 = bVar32, !bVar9)) {
                  bVar31 = true;
                }
              }
            }
          }
        }
        pvVar29 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  ((long)&(pvVar29->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start + 1);
        bVar32 = bVar31;
      } while (pvVar22 != pvVar29);
    }
    else {
      if (err != (string *)0x0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"Image data size is zero or too large: width = ",0x2e);
        poVar16 = (ostream *)std::ostream::operator<<(local_1a8,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,", height = ",0xb);
        poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar27);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,", channels = ",0xd);
        poVar16 = (ostream *)std::ostream::operator<<(poVar16,num_channels);
        std::endl<char,std::char_traits<char>>(poVar16);
        std::__cxx11::stringbuf::str();
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (err,local_240,local_238);
        if (local_240 != local_230) {
          operator_delete(local_240);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_138);
      }
LAB_0017272b:
      bVar31 = false;
    }
    iVar18 = -4;
    if (0x3ffffffffe < local_218) goto LAB_001728d4;
LAB_00172838:
    if (!bVar31) {
      if (0 < exr_header->num_channels) {
        piVar19 = exr_header->pixel_types;
        piVar7 = exr_header->requested_pixel_types;
        lVar28 = 0;
        do {
          piVar19[lVar28] = piVar7[lVar28];
          lVar28 = lVar28 + 1;
        } while (lVar28 < exr_header->num_channels);
      }
      exr_image->num_channels = num_channels;
      exr_image->width = iVar1;
      exr_image->height = iVar27;
      iVar18 = 0;
      goto LAB_001728d4;
    }
    iVar18 = -4;
    if (err == (string *)0x0) goto LAB_001728d4;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (err,"Invalid data found when decoding pixels.\n");
  }
  else if (exr_header->tile_size_x < 0) {
    iVar18 = -9;
    if (err == (string *)0x0) goto LAB_001728d4;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid tile size x : ",0x16);
    poVar16 = (ostream *)std::ostream::operator<<(local_1a8,exr_header->tile_size_x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (err,local_240,local_238);
    if (local_240 != local_230) {
      operator_delete(local_240);
    }
  }
  else {
    if (-1 < exr_header->tile_size_y) {
      puVar33 = (local_210->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      puVar5 = (local_210->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      __size = (long)puVar33 - (long)puVar5 >> 3;
      pEVar13 = (EXRTile *)calloc(0x20,__size);
      exr_image->tiles = pEVar13;
      if (puVar33 == puVar5) {
        pvVar22 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      }
      else {
        lVar30 = (__size - 1) + (ulong)(__size == 0);
        lVar28 = 0;
        pvVar22 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  ((ulong)puVar33 & 0xffffffff00000000);
        while( true ) {
          ppuVar14 = AllocateImage(num_channels,exr_header->channels,
                                   exr_header->requested_pixel_types,exr_header->tile_size_x,
                                   exr_header->tile_size_y);
          pEVar13 = exr_image->tiles;
          *(uchar ***)((long)&pEVar13->images + lVar28 * 4) = ppuVar14;
          lVar6 = *(long *)((long)(local_210->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data._M_start + lVar28);
          uVar10 = (undefined4)((ulong)pvVar22 >> 0x20);
          if (local_200 < lVar6 + 0x14U) break;
          iVar18 = *(int *)(head + lVar6 + 8);
          iVar24 = *(int *)(head + lVar6 + 0xc);
          bVar31 = true;
          if (iVar18 == 0 && iVar24 == 0) {
            uVar12 = (ulong)*(int *)(head + lVar6 + 0x10);
            if (((long)uVar12 < 4) || (local_200 - (lVar6 + 0x14U) < uVar12)) {
              pvVar22 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        CONCAT44(uVar10,0xfffffffc);
              if (err != (string *)0x0) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(err,"Insufficient data length.\n");
              }
            }
            else {
              iVar11 = *(int *)(head + lVar6);
              iVar2 = *(int *)(head + lVar6 + 4);
              uVar23 = exr_header->tile_size_x;
              if ((((iVar1 < (int)uVar23) || (iVar21 = exr_header->tile_size_y, iVar27 < iVar21)) ||
                  (local_220 = (ulong)(iVar1 - uVar23 * iVar11), iVar1 < (int)(uVar23 * iVar11))) ||
                 (iVar27 < iVar21 * iVar2)) {
                if (err != (string *)0x0) goto LAB_0017216c;
                pvVar22 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          CONCAT44(uVar10,0xfffffffc);
              }
              else {
                ppuVar14 = *(uchar ***)((long)&pEVar13->images + lVar28 * 4);
                piVar19 = exr_header->requested_pixel_types;
                compression_type = exr_header->compression_type;
                line_order = exr_header->line_order;
                iVar3 = exr_header->num_channels;
                if ((int)((iVar11 + 1) * uVar23) <= iVar17) {
                  local_220 = (ulong)uVar23;
                }
                attributes = (EXRAttribute *)exr_header->channels;
                (&pEVar13->width)[lVar28] = (int)local_220;
                num_lines = iVar27 - iVar21 * iVar2;
                if ((iVar2 + 1) * iVar21 <= (int)local_218) {
                  num_lines = iVar21;
                }
                (&pEVar13->height)[lVar28] = num_lines;
                local_204 = iVar24;
                bVar31 = DecodePixelData(ppuVar14,piVar19,head + lVar6 + 0x14,uVar12,
                                         compression_type,line_order,(int)local_220,iVar21,uVar23,0,
                                         0,num_lines,pixel_data_size,(long)iVar3,attributes,
                                         (size_t)&channel_offset_list,in_stack_fffffffffffffd68,
                                         pvVar22);
                uVar10 = SUB84(pvVar22,0);
                if (!bVar31) {
                  uVar10 = 0xfffffffc;
                }
                pvVar22 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          CONCAT44((int)((ulong)pvVar22 >> 0x20),uVar10);
                iVar24 = local_204;
                if (err != (string *)0x0 && !bVar31) {
LAB_0017216c:
                  pvVar22 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            CONCAT44((int)((ulong)pvVar22 >> 0x20),0xfffffffc);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(err,"Failed to decode tile data.\n");
                }
              }
              pEVar13 = exr_image->tiles;
              (&pEVar13->offset_x)[lVar28] = iVar11;
              (&pEVar13->offset_y)[lVar28] = iVar2;
              (&pEVar13->level_x)[lVar28] = iVar18;
              (&pEVar13->level_y)[lVar28] = iVar24;
              bVar31 = false;
            }
          }
          else {
            pvVar22 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      CONCAT44(uVar10,0xfffffff6);
          }
          bVar32 = lVar30 == 0;
          lVar30 = lVar30 + -1;
          if ((bVar31) || (lVar28 = lVar28 + 8, bVar32)) goto LAB_0017280f;
        }
        pvVar22 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  CONCAT44(uVar10,0xfffffffc);
        if (err != (string *)0x0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (err,"Insufficient data size.\n");
        }
      }
LAB_0017280f:
      iVar18 = (int)pvVar22;
      if (iVar18 != 0) goto LAB_001728d4;
      exr_image->num_tiles = (int)__size;
      bVar31 = false;
      goto LAB_00172838;
    }
    iVar18 = -9;
    if (err == (string *)0x0) goto LAB_001728d4;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid tile size y : ",0x16);
    poVar16 = (ostream *)std::ostream::operator<<(local_1a8,exr_header->tile_size_y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (err,local_240,local_238);
    if (local_240 != local_230) {
      operator_delete(local_240);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_138);
LAB_001728d4:
  if (channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return iVar18;
  }
  operator_delete(channel_offset_list.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return iVar18;
}

Assistant:

static int DecodeChunk(EXRImage *exr_image, const EXRHeader *exr_header,
                       const std::vector<tinyexr::tinyexr_uint64> &offsets,
                       const unsigned char *head, const size_t size,
                       std::string *err) {
  int num_channels = exr_header->num_channels;

  int num_scanline_blocks = 1;
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanline_blocks = 16;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanline_blocks = 32;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanline_blocks = 16;

#if TINYEXR_USE_ZFP
    tinyexr::ZFPCompressionParam zfp_compression_param;
    if (!FindZFPCompressionParam(&zfp_compression_param,
                                 exr_header->custom_attributes,
                                 int(exr_header->num_custom_attributes), err)) {
      return TINYEXR_ERROR_INVALID_HEADER;
    }
#endif
  }

  if (exr_header->data_window.max_x < exr_header->data_window.min_x ||
      exr_header->data_window.max_y < exr_header->data_window.min_y) {
    if (err) {
      (*err) += "Invalid data window.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  int data_width =
      exr_header->data_window.max_x - exr_header->data_window.min_x + 1;
  int data_height =
      exr_header->data_window.max_y - exr_header->data_window.min_y + 1;

  // Do not allow too large data_width and data_height. header invalid?
  {
    const int threshold = 1024 * 8192;  // heuristics
    if ((data_width > threshold) || (data_height > threshold)) {
      if (err) {
        std::stringstream ss;
        ss << "data_with or data_height too large. data_width: " << data_width
           << ", "
           << "data_height = " << data_height << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }
  }

  size_t num_blocks = offsets.size();

  std::vector<size_t> channel_offset_list;
  int pixel_data_size = 0;
  size_t channel_offset = 0;
  if (!tinyexr::ComputeChannelLayout(&channel_offset_list, &pixel_data_size,
                                     &channel_offset, num_channels,
                                     exr_header->channels)) {
    if (err) {
      (*err) += "Failed to compute channel layout.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  bool invalid_data = false;  // TODO(LTE): Use atomic lock for MT safety.

  if (exr_header->tiled) {
    // value check
    if (exr_header->tile_size_x < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size x : " << exr_header->tile_size_x << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    if (exr_header->tile_size_y < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size y : " << exr_header->tile_size_y << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    size_t num_tiles = offsets.size();  // = # of blocks

    exr_image->tiles = static_cast<EXRTile *>(
        calloc(sizeof(EXRTile), static_cast<size_t>(num_tiles)));

    int err_code = TINYEXR_SUCCESS;

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)

    std::vector<std::thread> workers;
    std::atomic<size_t> tile_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_tiles)) {
      num_threads = int(num_tiles);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        size_t tile_idx = 0;
        while ((tile_idx = tile_count++) < num_tiles) {

#else
    for (size_t tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
#endif
          // Allocate memory for each tile.
          exr_image->tiles[tile_idx].images = tinyexr::AllocateImage(
              num_channels, exr_header->channels,
              exr_header->requested_pixel_types, exr_header->tile_size_x,
              exr_header->tile_size_y);

          // 16 byte: tile coordinates
          // 4 byte : data size
          // ~      : data(uncompressed or compressed)
          if (offsets[tile_idx] + sizeof(int) * 5 > size) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Insufficient data size.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
            break;
          }

          size_t data_size =
              size_t(size - (offsets[tile_idx] + sizeof(int) * 5));
          const unsigned char *data_ptr =
              reinterpret_cast<const unsigned char *>(head + offsets[tile_idx]);

          int tile_coordinates[4];
          memcpy(tile_coordinates, data_ptr, sizeof(int) * 4);
          tinyexr::swap4(&tile_coordinates[0]);
          tinyexr::swap4(&tile_coordinates[1]);
          tinyexr::swap4(&tile_coordinates[2]);
          tinyexr::swap4(&tile_coordinates[3]);

          // @todo{ LoD }
          if (tile_coordinates[2] != 0) {
            err_code = TINYEXR_ERROR_UNSUPPORTED_FEATURE;
            break;
          }
          if (tile_coordinates[3] != 0) {
            err_code = TINYEXR_ERROR_UNSUPPORTED_FEATURE;
            break;
          }

          int data_len;
          memcpy(&data_len, data_ptr + 16,
                 sizeof(int));  // 16 = sizeof(tile_coordinates)
          tinyexr::swap4(&data_len);

          if (data_len < 4 || size_t(data_len) > data_size) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Insufficient data length.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
            break;
          }

          // Move to data addr: 20 = 16 + 4;
          data_ptr += 20;

          bool ret = tinyexr::DecodeTiledPixelData(
              exr_image->tiles[tile_idx].images,
              &(exr_image->tiles[tile_idx].width),
              &(exr_image->tiles[tile_idx].height),
              exr_header->requested_pixel_types, data_ptr,
              static_cast<size_t>(data_len), exr_header->compression_type,
              exr_header->line_order, data_width, data_height,
              tile_coordinates[0], tile_coordinates[1], exr_header->tile_size_x,
              exr_header->tile_size_y, static_cast<size_t>(pixel_data_size),
              static_cast<size_t>(exr_header->num_custom_attributes),
              exr_header->custom_attributes,
              static_cast<size_t>(exr_header->num_channels),
              exr_header->channels, channel_offset_list);

          if (!ret) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Failed to decode tile data.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
          }

          exr_image->tiles[tile_idx].offset_x = tile_coordinates[0];
          exr_image->tiles[tile_idx].offset_y = tile_coordinates[1];
          exr_image->tiles[tile_idx].level_x = tile_coordinates[2];
          exr_image->tiles[tile_idx].level_y = tile_coordinates[3];

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }  // num_thread loop

    for (auto &t : workers) {
      t.join();
    }

#else
    }
#endif

    if (err_code != TINYEXR_SUCCESS) {
      return err_code;
    }

    exr_image->num_tiles = static_cast<int>(num_tiles);
  } else {  // scanline format

    // Don't allow too large image(256GB * pixel_data_size or more). Workaround
    // for #104.
    size_t total_data_len =
        size_t(data_width) * size_t(data_height) * size_t(num_channels);
    const bool total_data_len_overflown =
        sizeof(void *) == 8 ? (total_data_len >= 0x4000000000) : false;
    if ((total_data_len == 0) || total_data_len_overflown) {
      if (err) {
        std::stringstream ss;
        ss << "Image data size is zero or too large: width = " << data_width
           << ", height = " << data_height << ", channels = " << num_channels
           << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    exr_image->images = tinyexr::AllocateImage(
        num_channels, exr_header->channels, exr_header->requested_pixel_types,
        data_width, data_height);

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
    std::vector<std::thread> workers;
    std::atomic<int> y_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_blocks)) {
      num_threads = int(num_blocks);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        int y = 0;
        while ((y = y_count++) < int(num_blocks)) {

#else

#if TINYEXR_USE_OPENMP
#pragma omp parallel for
#endif
    for (int y = 0; y < static_cast<int>(num_blocks); y++) {

#endif
          size_t y_idx = static_cast<size_t>(y);

          if (offsets[y_idx] + sizeof(int) * 2 > size) {
            invalid_data = true;
          } else {
            // 4 byte: scan line
            // 4 byte: data size
            // ~     : pixel data(uncompressed or compressed)
            size_t data_size =
                size_t(size - (offsets[y_idx] + sizeof(int) * 2));
            const unsigned char *data_ptr =
                reinterpret_cast<const unsigned char *>(head + offsets[y_idx]);

            int line_no;
            memcpy(&line_no, data_ptr, sizeof(int));
            int data_len;
            memcpy(&data_len, data_ptr + 4, sizeof(int));
            tinyexr::swap4(&line_no);
            tinyexr::swap4(&data_len);

            if (size_t(data_len) > data_size) {
              invalid_data = true;

            } else if ((line_no > (2 << 20)) || (line_no < -(2 << 20))) {
              // Too large value. Assume this is invalid
              // 2**20 = 1048576 = heuristic value.
              invalid_data = true;
            } else if (data_len == 0) {
              // TODO(syoyo): May be ok to raise the threshold for example
              // `data_len < 4`
              invalid_data = true;
            } else {
              // line_no may be negative.
              int end_line_no = (std::min)(line_no + num_scanline_blocks,
                                           (exr_header->data_window.max_y + 1));

              int num_lines = end_line_no - line_no;

              if (num_lines <= 0) {
                invalid_data = true;
              } else {
                // Move to data addr: 8 = 4 + 4;
                data_ptr += 8;

                // Adjust line_no with data_window.bmin.y

                // overflow check
                tinyexr_int64 lno =
                    static_cast<tinyexr_int64>(line_no) -
                    static_cast<tinyexr_int64>(exr_header->data_window.min_y);
                if (lno > std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else if (lno < -std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else {
                  line_no -= exr_header->data_window.min_y;
                }

                if (line_no < 0) {
                  invalid_data = true;
                } else {
                  if (!tinyexr::DecodePixelData(
                          exr_image->images, exr_header->requested_pixel_types,
                          data_ptr, static_cast<size_t>(data_len),
                          exr_header->compression_type, exr_header->line_order,
                          data_width, data_height, data_width, y, line_no,
                          num_lines, static_cast<size_t>(pixel_data_size),
                          static_cast<size_t>(
                              exr_header->num_custom_attributes),
                          exr_header->custom_attributes,
                          static_cast<size_t>(exr_header->num_channels),
                          exr_header->channels, channel_offset_list)) {
                    invalid_data = true;
                  }
                }
              }
            }
          }

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }

    for (auto &t : workers) {
      t.join();
    }
#else
    }  // omp parallel
#endif
  }

  if (invalid_data) {
    if (err) {
      std::stringstream ss;
      (*err) += "Invalid data found when decoding pixels.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Overwrite `pixel_type` with `requested_pixel_type`.
  {
    for (int c = 0; c < exr_header->num_channels; c++) {
      exr_header->pixel_types[c] = exr_header->requested_pixel_types[c];
    }
  }

  {
    exr_image->num_channels = num_channels;

    exr_image->width = data_width;
    exr_image->height = data_height;
  }

  return TINYEXR_SUCCESS;
}